

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O0

void __thiscall
QNetworkReplyHttpImplPrivate::setCachingEnabled(QNetworkReplyHttpImplPrivate *this,bool enable)

{
  undefined1 in_SIL;
  char *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff80;
  undefined3 in_stack_ffffffffffffff84;
  uint line;
  char cVar1;
  char *file;
  QMessageLogger *in_stack_ffffffffffffff90;
  QNetworkReplyHttpImplPrivate *in_stack_ffffffffffffff98;
  char local_50 [24];
  char *in_stack_ffffffffffffffc8;
  QDebug local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  line = CONCAT13(in_SIL,in_stack_ffffffffffffff84) & 0x1ffffff;
  cVar1 = (char)(line >> 0x18);
  if (((cVar1 != '\0') || ((in_RDI[0x2d0] & 1U) != 0)) &&
     ((cVar1 == '\0' || ((in_RDI[0x2d0] & 1U) == 0)))) {
    if (cVar1 == '\0') {
      QMessageLogger::QMessageLogger(in_stack_ffffffffffffff90,in_RDI,line,in_RDI);
      QMessageLogger::debug
                (&stack0xffffffffffffff90,
                 "QNetworkReplyImpl: setCachingEnabled(true) called after setCachingEnabled(false)")
      ;
      (**(code **)(**(long **)(*(long *)(in_RDI + 0x238) + 0x78) + 0x78))
                (*(long **)(*(long *)(in_RDI + 0x238) + 0x78),in_RDI + 0x1e0);
      in_RDI[0x2c8] = '\0';
      in_RDI[0x2c9] = '\0';
      in_RDI[0x2ca] = '\0';
      in_RDI[0x2cb] = '\0';
      in_RDI[0x2cc] = '\0';
      in_RDI[0x2cd] = '\0';
      in_RDI[0x2ce] = '\0';
      in_RDI[0x2cf] = '\0';
      in_RDI[0x2d0] = '\0';
    }
    else if (*(long *)(in_RDI + 0x2f0) == 0) {
      createCache(in_stack_ffffffffffffff98);
    }
    else {
      file = in_RDI;
      QMessageLogger::QMessageLogger(in_stack_ffffffffffffff90,in_RDI,line,in_RDI);
      QMessageLogger::debug();
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffff98,in_stack_ffffffffffffffc8);
      QDebug::operator<<((QDebug *)CONCAT44(line,in_stack_ffffffffffffff80),(qint64)in_RDI);
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffff98,in_stack_ffffffffffffffc8);
      QDebug::~QDebug(&local_10);
      QMessageLogger::QMessageLogger(in_stack_ffffffffffffff90,file,line,in_RDI);
      QMessageLogger::critical
                (local_50,
                 "QNetworkReplyImpl: backend error: caching was enabled after some bytes had been written"
                );
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkReplyHttpImplPrivate::setCachingEnabled(bool enable)
{
    if (!enable && !cacheEnabled)
        return;                 // nothing to do
    if (enable && cacheEnabled)
        return;                 // nothing to do either!

    if (enable) {
        if (Q_UNLIKELY(bytesDownloaded)) {
            qDebug() << "setCachingEnabled: " << bytesDownloaded << " bytesDownloaded";
            // refuse to enable in this case
            qCritical("QNetworkReplyImpl: backend error: caching was enabled after some bytes had been written");
            return;
        }

        createCache();
    } else {
        // someone told us to turn on, then back off?
        // ok... but you should make up your mind
        qDebug("QNetworkReplyImpl: setCachingEnabled(true) called after setCachingEnabled(false)");
        managerPrivate->networkCache->remove(url);
        cacheSaveDevice = nullptr;
        cacheEnabled = false;
    }
}